

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O1

void __thiscall
QGraphicsProxyWidget::hoverLeaveEvent(QGraphicsProxyWidget *this,QGraphicsSceneHoverEvent *event)

{
  long lVar1;
  long lVar2;
  int *piVar3;
  QPoint QVar4;
  QWidget *leave;
  long in_FS_OFFSET;
  QPointF local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 0x18);
  lVar2 = *(long *)(lVar1 + 0x218);
  if (((lVar2 != 0) && (*(int *)(lVar2 + 4) != 0)) && (*(long *)(lVar1 + 0x220) != 0)) {
    if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) {
      leave = (QWidget *)0x0;
    }
    else {
      leave = *(QWidget **)(lVar1 + 0x220);
    }
    QVar4 = QGraphicsSceneHoverEvent::screenPos(event);
    local_28.xp = (qreal)QVar4.xp.m_i.m_i;
    local_28.yp = (qreal)QVar4.yp.m_i.m_i;
    QApplicationPrivate::dispatchEnterLeave((QWidget *)0x0,leave,&local_28);
    piVar3 = *(int **)(lVar1 + 0x218);
    *(undefined8 *)(lVar1 + 0x218) = 0;
    *(undefined8 *)(lVar1 + 0x220) = 0;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        operator_delete(piVar3);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsProxyWidget::hoverLeaveEvent(QGraphicsSceneHoverEvent *event)
{
    Q_UNUSED(event);
    Q_D(QGraphicsProxyWidget);
    // If hoverMove was compressed away, make sure we update properly here.
    if (d->lastWidgetUnderMouse) {
        QApplicationPrivate::dispatchEnterLeave(nullptr, d->lastWidgetUnderMouse, event->screenPos());
        d->lastWidgetUnderMouse = nullptr;
    }
}